

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# RenX_BanDatabase.cpp
# Opt level: O1

void __thiscall
RenX::BanDatabase::add
          (BanDatabase *this,string *name,uint32_t ip,uint8_t prefix_length,uint64_t steamid,
          string *hwid,string *rdns,string *banner,string *reason,seconds length,uint16_t flags)

{
  Entry *__s;
  rep rVar1;
  undefined3 in_register_00000009;
  undefined4 uVar2;
  undefined4 in_register_0000000c;
  void *__buf;
  _Head_base<0UL,_RenX::BanDatabase::Entry_*,_false> local_48;
  string *local_40;
  string *local_38;
  
  uVar2 = CONCAT31(in_register_00000009,prefix_length);
  local_40 = hwid;
  local_38 = name;
  __s = (Entry *)operator_new(0x110);
  memset(__s,0,0x110);
  (__s->hwid)._M_dataplus._M_p = (pointer)&(__s->hwid).field_2;
  (__s->hwid)._M_string_length = 0;
  (__s->hwid).field_2._M_local_buf[0] = '\0';
  (__s->rdns)._M_dataplus._M_p = (pointer)&(__s->rdns).field_2;
  (__s->rdns)._M_string_length = 0;
  (__s->rdns).field_2._M_local_buf[0] = '\0';
  (__s->name)._M_dataplus._M_p = (pointer)&(__s->name).field_2;
  (__s->name)._M_string_length = 0;
  (__s->name).field_2._M_local_buf[0] = '\0';
  (__s->banner)._M_dataplus._M_p = (pointer)&(__s->banner).field_2;
  (__s->banner)._M_string_length = 0;
  (__s->banner).field_2._M_local_buf[0] = '\0';
  (__s->reason)._M_dataplus._M_p = (pointer)&(__s->reason).field_2;
  (__s->reason)._M_string_length = 0;
  (__s->reason).field_2._M_local_buf[0] = '\0';
  (__s->varData)._M_h._M_buckets = &(__s->varData)._M_h._M_single_bucket;
  (__s->varData)._M_h._M_bucket_count = 1;
  (__s->varData)._M_h._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
  (__s->varData)._M_h._M_element_count = 0;
  (__s->varData)._M_h._M_rehash_policy._M_max_load_factor = 1.0;
  (__s->varData)._M_h._M_rehash_policy._M_next_resize = 0;
  (__s->varData)._M_h._M_single_bucket = (__node_base_ptr)0x0;
  __s->flags = __s->flags | flags | 0x8000;
  local_48._M_head_impl = __s;
  rVar1 = std::chrono::_V2::system_clock::now();
  ((local_48._M_head_impl)->timestamp).__d.__r = rVar1;
  ((local_48._M_head_impl)->length).__r = length.__r;
  (local_48._M_head_impl)->steamid = steamid;
  (local_48._M_head_impl)->ip = ip;
  (local_48._M_head_impl)->prefix_length = prefix_length;
  std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::operator=
            (&(local_48._M_head_impl)->hwid,local_40);
  std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::operator=
            (&(local_48._M_head_impl)->rdns,rdns);
  std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::operator=
            (&(local_48._M_head_impl)->name,local_38);
  std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::operator=
            (&(local_48._M_head_impl)->banner,banner);
  std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::operator=
            (&(local_48._M_head_impl)->reason,reason);
  std::
  vector<std::unique_ptr<RenX::BanDatabase::Entry,std::default_delete<RenX::BanDatabase::Entry>>,std::allocator<std::unique_ptr<RenX::BanDatabase::Entry,std::default_delete<RenX::BanDatabase::Entry>>>>
  ::
  emplace_back<std::unique_ptr<RenX::BanDatabase::Entry,std::default_delete<RenX::BanDatabase::Entry>>>
            ((vector<std::unique_ptr<RenX::BanDatabase::Entry,std::default_delete<RenX::BanDatabase::Entry>>,std::allocator<std::unique_ptr<RenX::BanDatabase::Entry,std::default_delete<RenX::BanDatabase::Entry>>>>
              *)&this->m_entries,
             (unique_ptr<RenX::BanDatabase::Entry,_std::default_delete<RenX::BanDatabase::Entry>_> *
             )&local_48);
  write(this,(int)(this->m_entries).
                  super__Vector_base<std::unique_ptr<RenX::BanDatabase::Entry,_std::default_delete<RenX::BanDatabase::Entry>_>,_std::allocator<std::unique_ptr<RenX::BanDatabase::Entry,_std::default_delete<RenX::BanDatabase::Entry>_>_>_>
                  ._M_impl.super__Vector_impl_data._M_finish[-1]._M_t.
                  super___uniq_ptr_impl<RenX::BanDatabase::Entry,_std::default_delete<RenX::BanDatabase::Entry>_>
                  ._M_t.
                  super__Tuple_impl<0UL,_RenX::BanDatabase::Entry_*,_std::default_delete<RenX::BanDatabase::Entry>_>
                  .super__Head_base<0UL,_RenX::BanDatabase::Entry_*,_false>._M_head_impl,__buf,
        CONCAT44(in_register_0000000c,uVar2));
  std::unique_ptr<RenX::BanDatabase::Entry,_std::default_delete<RenX::BanDatabase::Entry>_>::
  ~unique_ptr((unique_ptr<RenX::BanDatabase::Entry,_std::default_delete<RenX::BanDatabase::Entry>_>
               *)&local_48);
  return;
}

Assistant:

void RenX::BanDatabase::add(std::string name, uint32_t ip, uint8_t prefix_length, uint64_t steamid, std::string hwid, std::string rdns, std::string banner, std::string reason, std::chrono::seconds length, uint16_t flags) {
	std::unique_ptr<Entry> entry = std::make_unique<Entry>();
	entry->set_active();
	entry->flags |= flags;
	entry->timestamp = std::chrono::system_clock::now();
	entry->length = length;
	entry->steamid = steamid;
	entry->ip = ip;
	entry->prefix_length = prefix_length;
	entry->hwid = std::move(hwid);
	entry->rdns = std::move(rdns);
	entry->name = std::move(name);
	entry->banner = std::move(banner);
	entry->reason = std::move(reason);

	m_entries.push_back(std::move(entry));
	write(m_entries.back().get());
}